

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab1.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  double d;
  int i;
  
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
  std::ostream::operator<<(this,5.0);
  return 0;
}

Assistant:

int main() {
    int i;
    double d;
    i = 5;
    d = 5;
    std::cout << i << d;
    return 0;
}